

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

void positionDequeFindAdjacentTS
               (double ts,dequePositionTy *l,positionTy **pBefore,positionTy **pAfter)

{
  bool bVar1;
  double *pdVar2;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  double in_XMM0_Qa;
  positionTy *p;
  iterator __end1;
  iterator __begin1;
  dequePositionTy *__range1;
  _Self *in_stack_ffffffffffffff88;
  reference in_stack_ffffffffffffff90;
  _Deque_iterator<positionTy,_positionTy_&,_positionTy_*> local_48;
  undefined8 *local_20;
  undefined8 *local_18;
  double local_8;
  
  *in_RDX = 0;
  *in_RSI = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_8 = in_XMM0_Qa;
  std::deque<positionTy,_std::allocator<positionTy>_>::begin
            ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_ffffffffffffff88);
  std::deque<positionTy,_std::allocator<positionTy>_>::end
            ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      return;
    }
    in_stack_ffffffffffffff90 =
         std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator*(&local_48);
    pdVar2 = positionTy::ts(in_stack_ffffffffffffff90);
    if (local_8 < *pdVar2) break;
    *local_18 = in_stack_ffffffffffffff90;
    std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator++
              ((_Deque_iterator<positionTy,_positionTy_&,_positionTy_*> *)in_stack_ffffffffffffff90)
    ;
  }
  *local_20 = in_stack_ffffffffffffff90;
  return;
}

Assistant:

void positionDequeFindAdjacentTS (double ts, dequePositionTy& l,
                                  positionTy*& pBefore, positionTy*& pAfter)
{
    // init
    pBefore = pAfter = nullptr;
    
    // loop
    for (positionTy& p: l) {
        if (p.ts() <= ts)
            pBefore = &p;           // while less than timestamp keep pBefore updated
        else {
            pAfter = &p;            // now found (first) position greater then ts
            return;                 // short-cut...ts in l would only further increase
        }
    }
}